

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O0

char * save_settings(char *section,Conf *conf)

{
  char *local_30;
  char *errmsg;
  settings_w *sesskey;
  Conf *conf_local;
  char *section_local;
  
  sesskey = (settings_w *)conf;
  conf_local = (Conf *)section;
  errmsg = (char *)open_settings_w(section,&local_30);
  if ((settings_w *)errmsg == (settings_w *)0x0) {
    section_local = local_30;
  }
  else {
    save_open_settings((settings_w *)errmsg,(Conf *)sesskey);
    close_settings_w((settings_w *)errmsg);
    section_local = (char *)0x0;
  }
  return section_local;
}

Assistant:

char *save_settings(const char *section, Conf *conf)
{
    struct settings_w *sesskey;
    char *errmsg;

    sesskey = open_settings_w(section, &errmsg);
    if (!sesskey)
        return errmsg;
    save_open_settings(sesskey, conf);
    close_settings_w(sesskey);
    return NULL;
}